

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_modifiers_unittest.cc
# Opt level: O0

void __thiscall
Test_TemplateModifiers_DefaultModifiersForContext::Test_TemplateModifiers_DefaultModifiersForContext
          (Test_TemplateModifiers_DefaultModifiersForContext *this)

{
  value_type local_18;
  Test_TemplateModifiers_DefaultModifiersForContext *local_10;
  Test_TemplateModifiers_DefaultModifiersForContext *this_local;
  
  local_18 = Run;
  local_10 = this;
  std::vector<void_(*)(),_std::allocator<void_(*)()>_>::push_back(&g_testlist,&local_18);
  return;
}

Assistant:

TEST(TemplateModifiers, DefaultModifiersForContext) {
  const GOOGLE_NAMESPACE::ModifierAndValue* modval;
  string print_mods;

  const vector<const GOOGLE_NAMESPACE::ModifierAndValue*> modvals_html =
      GOOGLE_NAMESPACE::GetDefaultModifierForHtml();
  EXPECT_EQ(1, modvals_html.size());
  print_mods = GOOGLE_NAMESPACE::PrettyPrintModifiers(modvals_html, ";");
  EXPECT_STREQ(":h", print_mods.c_str());
  modval = modvals_html.front();
  EXPECT_EQ(modval->modifier_info->modifier, &GOOGLE_NAMESPACE::html_escape);

  const vector<const GOOGLE_NAMESPACE::ModifierAndValue*> modvals_js =
      GOOGLE_NAMESPACE::GetDefaultModifierForJs();
  EXPECT_EQ(1, modvals_js.size());
  print_mods = GOOGLE_NAMESPACE::PrettyPrintModifiers(modvals_js, ";");
  EXPECT_STREQ(":j", print_mods.c_str());
  modval = modvals_js.front();
  EXPECT_EQ(modval->modifier_info->modifier, &GOOGLE_NAMESPACE::javascript_escape);

  const vector<const GOOGLE_NAMESPACE::ModifierAndValue*> modvals_xml =
      GOOGLE_NAMESPACE::GetDefaultModifierForXml();
  EXPECT_EQ(1, modvals_xml.size());
  print_mods = GOOGLE_NAMESPACE::PrettyPrintModifiers(modvals_xml, ";");
  EXPECT_STREQ(":xml_escape", print_mods.c_str());
  modval = modvals_xml.front();
  EXPECT_EQ(modval->modifier_info->modifier, &GOOGLE_NAMESPACE::xml_escape);

  const vector<const GOOGLE_NAMESPACE::ModifierAndValue*> modvals_json =
      GOOGLE_NAMESPACE::GetDefaultModifierForJson();
  EXPECT_EQ(1, modvals_json.size());
  print_mods = GOOGLE_NAMESPACE::PrettyPrintModifiers(modvals_json, ";");
  EXPECT_STREQ(":j", print_mods.c_str());
  modval = modvals_json.front();
  EXPECT_EQ(modval->modifier_info->modifier, &GOOGLE_NAMESPACE::javascript_escape);
}